

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_MinipointCounterTest_ChooseHighestPointsWait_AnotherHandOrder_TestShell::
~TEST_MinipointCounterTest_ChooseHighestPointsWait_AnotherHandOrder_TestShell
          (TEST_MinipointCounterTest_ChooseHighestPointsWait_AnotherHandOrder_TestShell *this)

{
  TEST_MinipointCounterTest_ChooseHighestPointsWait_AnotherHandOrder_TestShell *mem;
  TEST_MinipointCounterTest_ChooseHighestPointsWait_AnotherHandOrder_TestShell *this_local;
  
  mem = this;
  ~TEST_MinipointCounterTest_ChooseHighestPointsWait_AnotherHandOrder_TestShell(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(MinipointCounterTest, ChooseHighestPointsWait_AnotherHandOrder)
{
	addPair(Tile::SouthWind);
	addSequence(Tile::ThreeOfCharacters, false);
	addSequence(Tile::OneOfCharacters, false);
	addSequence(Tile::OneOfCircles, true);
	addSequence(Tile::OneOfBamboos, true);

	h.last_tile = Tile::ThreeOfCharacters;
	s.winByDiscard();
	CHECK_EQUAL(22, m.total(false));
}